

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O2

void sel25519(int64_t *p,int64_t *q,int64_t b)

{
  long lVar1;
  ulong uVar2;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    uVar2 = (q[lVar1] ^ p[lVar1]) & -b;
    p[lVar1] = p[lVar1] ^ uVar2;
    q[lVar1] = q[lVar1] ^ uVar2;
  }
  return;
}

Assistant:

static void sel25519(gf p, gf q, int64_t b)
{
  int64_t tmp, mask = ~(b-1);
  size_t i;
  for (i = 0; i < 16; i++)
  {
    tmp = mask & (p[i] ^ q[i]);
    p[i] ^= tmp;
    q[i] ^= tmp;
  }
}